

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O2

int PAL_wvsscanf(LPCWSTR Buffer,LPCWSTR Format,__va_list_tag *ap)

{
  char16_t cVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  char16_t cVar6;
  FILE *pFVar7;
  char cVar8;
  byte bVar9;
  char16_t cVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  undefined4 uVar14;
  errno_t eVar15;
  int iVar16;
  DWORD DVar17;
  LPCWSTR pWVar18;
  size_t sVar19;
  char *pcVar20;
  undefined7 uVar23;
  undefined8 *puVar21;
  LPSTR lpMultiByteStr;
  size_t sVar22;
  ulong uVar24;
  long *plVar25;
  ulong uVar26;
  ulong uVar27;
  char16_t *pcVar28;
  long lVar29;
  LPCWSTR lpWideCharStr;
  char *_Dst;
  long in_FS_OFFSET;
  ulong uStackY_4a0;
  int local_480;
  uint local_464;
  int local_460;
  int n;
  undefined4 local_458;
  undefined4 local_454;
  char *local_450;
  undefined4 local_444;
  undefined4 local_440;
  int local_43c;
  undefined2 local_438;
  char local_436 [6];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_43c = -1;
  local_460 = 0;
  pWVar18 = Buffer;
LAB_0030b9f7:
  iVar12 = local_460;
  lpWideCharStr = pWVar18;
  while( true ) {
    iVar11 = iVar12;
    if ((*Format == L'\0') || ((*lpWideCharStr == L'\0' && (iVar11 = -1, iVar12 == 0))))
    goto LAB_0030c51f;
    iVar11 = isspace((uint)(ushort)*Format);
    if (iVar11 == 0) break;
    lpWideCharStr = lpWideCharStr + -1;
    do {
      pWVar18 = lpWideCharStr + 1;
      lpWideCharStr = lpWideCharStr + 1;
      iVar11 = isspace((uint)(ushort)*pWVar18);
    } while (iVar11 != 0);
    Format = Format + 1;
  }
  iVar11 = iVar12;
  if (*Format == L'%') {
    pcVar28 = Format + 1;
    local_438 = CONCAT11(local_438._1_1_,0x25);
    sVar19 = PAL_wcslen(pcVar28);
    pcVar20 = (char *)PAL_malloc(sVar19 + 1);
    if (pcVar20 == (char *)0x0) {
      DVar17 = 8;
      local_43c = -1;
      Format = pcVar28;
joined_r0x0030bbad:
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0030c619;
      SetLastError(DVar17);
      iVar11 = iVar12;
      goto LAB_0030c08b;
    }
    cVar1 = *pcVar28;
    _Dst = (char *)((long)&local_438 + 1);
    cVar10 = cVar1;
    if (cVar1 == L'*') {
      local_438 = CONCAT11(0x2a,(char)local_438);
      cVar10 = Format[2];
      _Dst = local_436;
      pcVar28 = Format + 2;
    }
    Format = pcVar28;
    iVar12 = isdigit((uint)(ushort)cVar10);
    if (iVar12 == 0) {
      uVar26 = 0xffffffff;
    }
    else {
      lVar29 = 0;
      while (iVar12 = isdigit((uint)(ushort)*Format), iVar12 != 0) {
        pcVar20[lVar29] = (char)*Format;
        cVar10 = *Format;
        Format = Format + 1;
        _Dst[lVar29] = (char)cVar10;
        lVar29 = lVar29 + 1;
      }
      pcVar20[lVar29] = '\0';
      uVar13 = atoi(pcVar20);
      if ((int)uVar13 < 0) {
        DVar17 = 0x54f;
        local_43c = -1;
        iVar12 = local_460;
        goto joined_r0x0030bbad;
      }
      uVar26 = (ulong)uVar13;
      _Dst = _Dst + lVar29;
    }
    cVar10 = *Format;
    uStackY_4a0 = (ulong)(ushort)cVar10;
    if (cVar10 == L'w') {
LAB_0030bbb8:
      pcVar28 = Format + 1;
      cVar10 = Format[1];
      uStackY_4a0 = (ulong)(ushort)cVar10;
      if ((cVar10 == L'C') || (cVar10 == L'S')) {
        iVar12 = 2;
LAB_0030bbff:
        uStackY_4a0 = (ulong)(ushort)*pcVar28;
      }
      else {
        iVar12 = -1;
        if (cVar10 == L'l') {
          pcVar28 = Format + 2;
          iVar12 = 3;
          goto LAB_0030bbff;
        }
      }
LAB_0030bc03:
      iVar11 = (int)uStackY_4a0;
      uVar27 = (ulong)(iVar11 - 0x58U);
      if (0x20 < iVar11 - 0x58U) {
        if (iVar11 != 0x20) {
          if (iVar11 == 0x53) goto switchD_0030bc1c_caseD_1b;
          if ((iVar11 == 0x45) || (iVar11 == 0x47)) goto switchD_0030bc1c_caseD_d;
          uVar24 = uVar27;
          if (iVar11 == 0x43) goto switchD_0030bc1c_caseD_b;
          goto switchD_0030bc1c_caseD_1;
        }
        local_43c = 7;
LAB_0030bf34:
        local_440 = 0;
        local_444 = 0;
        local_450 = (char *)CONCAT44(local_450._4_4_,iVar12);
        local_454 = 0;
        local_458 = 0;
        n = 0;
        bVar5 = true;
        Format = pcVar28;
        goto LAB_0030c066;
      }
      uVar24 = (long)&switchD_0030bc1c::switchdataD_00de52ac +
               (long)(int)(&switchD_0030bc1c::switchdataD_00de52ac)[uVar27];
      switch(uVar27) {
      case 0:
      case 0xc:
      case 0x11:
      case 0x17:
      case 0x18:
      case 0x1d:
      case 0x20:
        if (iVar12 == 3) {
LAB_0030bd3f:
          eVar15 = strcpy_s(_Dst,0x400,"ll");
          if (eVar15 != 0) {
            DVar17 = 0x7a;
            local_43c = 3;
            Format = pcVar28;
            iVar12 = local_460;
            goto joined_r0x0030bbad;
          }
          sVar22 = strlen("ll");
          _Dst = _Dst + sVar22;
          local_450 = (char *)CONCAT44(local_450._4_4_,3);
        }
        else {
          uVar14 = 1;
          if (iVar12 == 2) {
            *_Dst = 'l';
            uVar14 = 2;
          }
          else {
            if (iVar12 != 1) {
              local_450 = (char *)CONCAT44(local_450._4_4_,iVar12);
              goto LAB_0030bda5;
            }
            *_Dst = 'h';
          }
          _Dst = _Dst + 1;
          local_450 = (char *)CONCAT44(local_450._4_4_,uVar14);
        }
LAB_0030bda5:
        Format = pcVar28 + 1;
        *_Dst = (char)*pcVar28;
        _Dst = _Dst + 1;
        local_444 = 0;
        n = 0;
        local_454 = 0;
        local_440 = 0;
        local_43c = 3;
        break;
      default:
switchD_0030bc1c_caseD_1:
        local_43c = -1;
        goto LAB_0030bf34;
      case 3:
        local_450 = (char *)CONCAT44(local_450._4_4_,iVar12);
        *_Dst = '[';
        cVar10 = pcVar28[1];
        if (cVar10 == L'^') {
          _Dst[1] = '^';
          _Dst = _Dst + 2;
          cVar10 = pcVar28[2];
          Format = pcVar28 + 2;
        }
        else {
          _Dst = _Dst + 1;
          Format = pcVar28 + 1;
        }
        if (cVar10 == L']') {
          *_Dst = ']';
          _Dst = _Dst + 1;
          cVar10 = Format[1];
          Format = Format + 1;
        }
        if (cVar10 == L'-') {
          *_Dst = '-';
          _Dst = _Dst + 1;
          Format = Format + 1;
        }
        do {
          cVar10 = *Format;
          if (cVar10 == L'-') {
            cVar10 = Format[1];
            if (cVar10 == L']') {
              *_Dst = '-';
              goto LAB_0030bf90;
            }
            cVar6 = Format[-1];
            if ((ushort)(cVar10 & 0xffU) < (ushort)(byte)cVar6) {
              _Dst[-1] = (char)cVar10;
              cVar10 = (ushort)(byte)cVar6;
            }
            *_Dst = '-';
            _Dst[1] = (char)cVar10;
            _Dst = _Dst + 2;
            lVar29 = 4;
          }
          else {
            if (cVar10 == L'\0') goto LAB_0030bfda;
            if (cVar10 == L']') goto code_r0x0030bfcf;
            *_Dst = (char)cVar10;
LAB_0030bf90:
            _Dst = _Dst + 1;
            lVar29 = 2;
          }
          Format = (LPCWSTR)((long)Format + lVar29);
        } while( true );
      case 0xb:
switchD_0030bc1c_caseD_b:
        if (iVar12 == 1) {
          local_450 = (char *)CONCAT44(local_450._4_4_,1);
        }
        else if ((iVar12 == 2) || ((short)uStackY_4a0 == 99)) {
          *_Dst = 'l';
          _Dst = _Dst + 1;
          local_450 = (char *)CONCAT44(local_450._4_4_,2);
        }
        else {
          local_450 = (char *)CONCAT44(local_450._4_4_,iVar12);
        }
        local_43c = 1;
        *_Dst = 'c';
        _Dst = _Dst + 1;
        Format = pcVar28 + 1;
        uVar23 = (undefined7)(uVar24 >> 8);
        n = (int)CONCAT71(uVar23,1);
        local_444 = 0;
        local_454 = 0;
        local_458 = (undefined4)CONCAT71(uVar23,1);
        local_440 = 0;
        goto LAB_0030c05d;
      case 0xd:
      case 0xe:
      case 0xf:
switchD_0030bc1c_caseD_d:
        local_450 = (char *)CONCAT44(local_450._4_4_,iVar12);
        Format = pcVar28 + 1;
        iVar12 = tolower(iVar11);
        *_Dst = (char)iVar12;
        _Dst = _Dst + 1;
        local_444 = 0;
        n = 0;
        local_454 = 0;
        local_440 = 0;
        local_43c = 5;
        break;
      case 0x16:
        cVar8 = 'n';
        local_450 = (char *)CONCAT44(local_450._4_4_,iVar12);
        if (iVar12 == 1) {
          *_Dst = 'h';
          _Dst = _Dst + 1;
          cVar8 = (char)*pcVar28;
        }
        Format = pcVar28 + 1;
        *_Dst = cVar8;
        _Dst = _Dst + 1;
        local_444 = (undefined4)CONCAT71((int7)(uStackY_4a0 >> 8),1);
        n = 0;
        local_454 = 0;
        local_440 = 0;
        local_43c = 4;
        break;
      case 0x1b:
switchD_0030bc1c_caseD_1b:
        if (iVar12 == 1) {
          uStackY_4a0 = 1;
LAB_0030c017:
          iVar12 = (int)uStackY_4a0;
        }
        else if ((iVar12 == 2) || ((short)uStackY_4a0 == 0x73)) {
          *_Dst = 'l';
          _Dst = _Dst + 1;
          uStackY_4a0 = 2;
          goto LAB_0030c017;
        }
        local_450 = (char *)CONCAT44(local_450._4_4_,iVar12);
        *_Dst = 's';
        _Dst = _Dst + 1;
        Format = pcVar28 + 1;
        uVar23 = (undefined7)(uStackY_4a0 >> 8);
        n = (int)CONCAT71(uVar23,1);
        local_444 = 0;
        local_454 = 0;
        local_440 = (undefined4)CONCAT71(uVar23,1);
        local_43c = 2;
      }
      goto LAB_0030c05c;
    }
    if (cVar10 == L'L') {
      pcVar28 = Format + 1;
      iVar12 = -1;
      goto LAB_0030bbff;
    }
    if (cVar10 == L'h') {
      pcVar28 = Format + 1;
      iVar12 = 1;
      goto LAB_0030bbff;
    }
    if (cVar10 == L'l') goto LAB_0030bbb8;
    pcVar28 = Format;
    if (cVar10 == L'p') goto LAB_0030bd3f;
    if (cVar10 != L'I') {
      iVar12 = -1;
      goto LAB_0030bc03;
    }
    if (Format[1] == L'6') {
      pcVar28 = Format + 3;
      if (Format[2] != L'4') {
        pcVar28 = Format;
      }
      iVar12 = (uint)(Format[2] == L'4') * 4 + -1;
      goto LAB_0030bbff;
    }
    bVar5 = true;
    local_444 = 0;
    local_450 = (char *)CONCAT44(local_450._4_4_,0xffffffff);
    n = 0;
    local_454 = 0;
    local_458 = 0;
    local_440 = 0;
    local_43c = -1;
    goto LAB_0030c066;
  }
  goto LAB_0030c08b;
code_r0x0030bfcf:
  *_Dst = ']';
  _Dst = _Dst + 1;
  Format = Format + 1;
LAB_0030bfda:
  local_454 = (undefined4)CONCAT71((uint7)(byte)((ushort)cVar10 >> 8),1);
  local_444 = 0;
  n = 0;
  local_440 = 0;
  local_43c = 6;
LAB_0030c05c:
  local_458 = 0;
LAB_0030c05d:
  bVar5 = false;
LAB_0030c066:
  _Dst[0] = '%';
  _Dst[1] = 'n';
  _Dst[2] = '\0';
  PAL_free(pcVar20);
  iVar11 = local_460;
  if (bVar5) {
LAB_0030c08b:
    if ((*Format != *lpWideCharStr) || (local_43c == 7)) goto LAB_0030c51f;
    Format = Format + 1;
    pWVar18 = lpWideCharStr + 1;
    goto LAB_0030b9f7;
  }
  iVar12 = (int)uVar26;
  if ((int)local_450 == 2) {
    if ((char)n != '\0') {
      bVar9 = iVar12 == -1 & (byte)local_458;
      if (bVar9 != 0) {
        iVar12 = 1;
      }
      uVar13 = (uint)bVar9;
      while( true ) {
        lVar29 = (long)(int)uVar13;
        if (lpWideCharStr[lVar29] == L'\0') break;
        iVar11 = isspace((uint)(ushort)lpWideCharStr[lVar29]);
        if ((iVar11 != 0) || (iVar12 != -1 && iVar12 <= (int)uVar13)) break;
        uVar13 = uVar13 + 1;
      }
      pWVar18 = lpWideCharStr + lVar29;
      if (cVar1 != L'*') {
        uVar2 = ap->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          plVar25 = (long *)((ulong)uVar2 + (long)ap->reg_save_area);
          ap->gp_offset = uVar2 + 8;
        }
        else {
          plVar25 = (long *)ap->overflow_arg_area;
          ap->overflow_arg_area = plVar25 + 1;
        }
        lVar3 = *plVar25;
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        for (uVar26 = 0; uVar13 != uVar26; uVar26 = uVar26 + 1) {
          *(WCHAR *)(lVar3 + uVar26 * 2) = lpWideCharStr[uVar26];
        }
        if ((char)local_440 != '\0') {
          *(undefined2 *)(lVar3 + lVar29 * 2) = 0;
        }
        local_460 = local_460 + 1;
      }
      goto LAB_0030b9f7;
    }
    if ((char)local_444 == '\0') {
LAB_0030c27c:
      iVar11 = -1;
      iVar16 = WideCharToMultiByte(0,0,lpWideCharStr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
      if (iVar16 == 0) {
        fprintf(_stderr,"] %s %s:%d","PAL_wvsscanf",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
                ,0x554);
        pFVar7 = _stderr;
        DVar17 = GetLastError();
        fprintf(pFVar7,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar17);
        goto LAB_0030c51f;
      }
      lpMultiByteStr = (LPSTR)PAL_malloc((long)iVar16);
      if (lpMultiByteStr == (LPSTR)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) {
LAB_0030c619:
          abort();
        }
        SetLastError(8);
LAB_0030c51f:
        if (*(long *)(in_FS_OFFSET + 0x28) == TempBuff._1016_8_) {
          return iVar11;
        }
        __stack_chk_fail();
      }
      local_450 = lpMultiByteStr;
      iVar16 = WideCharToMultiByte(0,0,lpWideCharStr,iVar16,lpMultiByteStr,iVar16,(LPCSTR)0x0,
                                   (LPBOOL)0x0);
      pcVar20 = local_450;
      if (iVar16 == 0) {
        fprintf(_stderr,"] %s %s:%d","PAL_wvsscanf",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printf.cpp"
                ,0x563);
        pFVar7 = _stderr;
        DVar17 = GetLastError();
        fprintf(pFVar7,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar17);
        PAL_free(local_450);
        goto LAB_0030c51f;
      }
      if (cVar1 == L'*') {
        iVar12 = sscanf_s(local_450,(char *)&local_438,&local_464);
        goto LAB_0030c30d;
      }
      if ((char)local_454 != '\0') {
        sVar22 = strlen((char *)&local_438);
        pcVar20 = local_450;
        iVar12 = (int)sVar22 + 1;
        while (iVar12 != 0) {
          local_436[(long)iVar12 + -2] = local_436[(long)(iVar12 + -1) + -2];
          iVar12 = iVar12 + -1;
        }
        local_438 = 0x2a25;
        local_464 = 0;
        iVar12 = 0;
        sscanf_s(local_450,(char *)&local_438,&local_464);
        if ((long)(int)local_464 != 0) {
          uVar13 = ap->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            plVar25 = (long *)((ulong)uVar13 + (long)ap->reg_save_area);
            ap->gp_offset = uVar13 + 8;
          }
          else {
            plVar25 = (long *)ap->overflow_arg_area;
            ap->overflow_arg_area = plVar25 + 1;
          }
          lVar29 = *plVar25;
          uVar26 = 0;
          if (0 < (int)local_464) {
            uVar26 = (ulong)local_464;
          }
          for (uVar27 = 0; uVar26 != uVar27; uVar27 = uVar27 + 1) {
            *(WCHAR *)(lVar29 + uVar27 * 2) = lpWideCharStr[uVar27];
          }
          *(undefined2 *)(lVar29 + (long)(int)local_464 * 2) = 0;
          iVar12 = 1;
          pcVar20 = local_450;
        }
        goto LAB_0030c30d;
      }
      uVar13 = ap->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        puVar21 = (undefined8 *)((ulong)uVar13 + (long)ap->reg_save_area);
        ap->gp_offset = uVar13 + 8;
      }
      else {
        puVar21 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar21 + 1;
      }
      uVar4 = *puVar21;
      if (local_43c == 1) {
        if (iVar12 < 2) {
          uVar26 = 1;
        }
LAB_0030c4b1:
        pcVar20 = local_450;
        iVar12 = sscanf_s(local_450,(char *)&local_438,uVar4,uVar26);
      }
      else {
        if (local_43c == 2) {
          if (iVar12 < 1) {
            sVar19 = PAL_wcslen(Buffer);
            iVar12 = (int)sVar19;
          }
          uVar26 = (ulong)(iVar12 + 1U);
          if (iVar12 + 1U != 0) goto LAB_0030c4b1;
        }
        pcVar20 = local_450;
        iVar12 = sscanf_s(local_450,(char *)&local_438,uVar4,&local_464);
      }
LAB_0030c30d:
      PAL_free(pcVar20);
      iVar11 = local_460;
      if (iVar12 < 1) goto LAB_0030c51f;
      local_460 = local_460 + iVar12;
      pWVar18 = lpWideCharStr + (int)local_464;
      goto LAB_0030b9f7;
    }
  }
  else {
    if ((char)local_444 == '\0') goto LAB_0030c27c;
    if ((int)local_450 == 1) {
      uVar13 = ap->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        puVar21 = (undefined8 *)((ulong)uVar13 + (long)ap->reg_save_area);
        ap->gp_offset = uVar13 + 8;
      }
      else {
        puVar21 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar21 + 1;
      }
      local_480 = (int)Buffer;
      *(short *)*puVar21 = (short)((uint)((int)lpWideCharStr - local_480) >> 1);
      goto LAB_0030c217;
    }
  }
  uVar13 = ap->gp_offset;
  if ((ulong)uVar13 < 0x29) {
    puVar21 = (undefined8 *)((ulong)uVar13 + (long)ap->reg_save_area);
    ap->gp_offset = uVar13 + 8;
  }
  else {
    puVar21 = (undefined8 *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar21 + 1;
  }
  *(int *)*puVar21 = (int)((ulong)((long)lpWideCharStr - (long)Buffer) >> 1);
LAB_0030c217:
  local_43c = 4;
  pWVar18 = lpWideCharStr;
  goto LAB_0030b9f7;
}

Assistant:

__attribute__((no_instrument_function))
int PAL_wvsscanf(LPCWSTR Buffer, LPCWSTR Format, va_list ap)
{
    INT Length = 0;
    LPCWSTR Buff = Buffer;
    LPCWSTR Fmt = Format;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    BOOL Store;
    INT Width;
    INT Prefix;
    INT Type = -1;

    while (*Fmt)
    {
        if (!*Buff && Length == 0)
        {
            Length = EOF;
            break;
        }
        /* remove any number of blanks */
        else if (isspace(*Fmt))
        {
            while (isspace(*Buff))
            {
                ++Buff;
            }
            ++Fmt;
        }
        else if (*Fmt == '%' &&
                 Internal_ScanfExtractFormatW(&Fmt, TempBuff, sizeof(TempBuff), &Store,
                                              &Width, &Prefix, &Type))
        {
            if (Prefix == SCANF_PREFIX_LONG &&
                (Type == SCANF_TYPE_STRING || Type == SCANF_TYPE_CHAR))
            {
                int len = 0;
                WCHAR *charPtr = 0;

                /* a single character */
                if (Type == SCANF_TYPE_CHAR && Width == -1)
                {
                    len = Width = 1;
                }

                /* calculate length of string to copy */
                while (Buff[len] && !isspace(Buff[len]))
                {
                    if (Width != -1 && len >= Width)
                    {
                        break;
                    }
                    ++len;
                }

                if (Store)
                {
                    int i;
                    charPtr = va_arg(ap, WCHAR *);

                    for (i = 0; i < len; i++)
                    {
                        charPtr[i] = Buff[i];
                    }
                    if (Type == SCANF_TYPE_STRING)
                    {
                        /* end string */
                        charPtr[len] = 0;
                    }
                    ++Length;
                }
                Buff += len;
            }
            /* this places the number of bytes stored into the next arg */
            else if (Type == SCANF_TYPE_N)
            {
                if (Prefix == SCANF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = Buff - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = Buff - Buffer;
                }
            }
            /* types that sscanf can handle */
            else
            {
                int ret;
                int n;
                int size;
                LPSTR newBuff = 0;
                LPVOID voidPtr = NULL;

                size = WideCharToMultiByte(CP_ACP, 0, Buff, -1, 0, 0, 0, 0);
                if (!size)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    return -1;
                }
                newBuff = (LPSTR) PAL_malloc(size);
                if (!newBuff)
                {
                    ERROR("PAL_malloc failed\n");
                    SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    return -1;
                }
                size = WideCharToMultiByte(CP_ACP, 0, Buff, size,
                                           newBuff, size, 0, 0);
                if (!size)
                {
                    ASSERT("WideCharToMultiByte failed.  Error is %d\n",
                        GetLastError());
                    PAL_free(newBuff);
                    return -1;
                }

                if (Store)
                {
                    if (Type == SCANF_TYPE_BRACKETS)
                    {
                        WCHAR *strPtr;
                        int i;

                        /* add a '*' to %[] --> %*[]  */
                        i = strlen(TempBuff) + 1;
                        while (i)
                        {
                            /* shift everything right one */
                            TempBuff[i] = TempBuff[i - 1];
                            --i;
                        }
                        TempBuff[0] = '%';
                        TempBuff[1] = '*';

                        /* %n doesn't count as a conversion. Since we're
                           suppressing conversion of the %[], sscanf will
                           always return 0, so we can't use the return value
                           to determine success. Set n to 0 before the call; if
                           it's still 0 afterwards, we know the call failed */
                        n = 0;
                        sscanf_s(newBuff, TempBuff, &n);
                        if(0 == n)
                        {
                            /* sscanf failed, nothing matched. set ret to 0,
                               so we know we have to break */
                            ret = 0;
                        }
                        else
                        {
                            strPtr = va_arg(ap, WCHAR *);
                            for (i = 0; i < n; i++)
                            {
                                strPtr[i] = Buff[i];
                            }
                            strPtr[n] = 0; /* end string */
                            ret = 1;
                        }
                    }
                    else
                    {
                        voidPtr = va_arg(ap, LPVOID);
                        // sscanf_s requires that if we are trying to read "%s" or "%c", then
                        // the size of the buffer must follow the buffer we are trying to read into.
                        unsigned typeLen = 0;
                        if (Type == SCANF_TYPE_STRING)
                        {
                            // We don't really know the size of the destination buffer provided by the
                            // caller. So we have to assume that the caller has allocated enough space
                            // to hold either the width specified in the format or the entire input
                            // string plus '\0'.
                            typeLen = ((Width > 0) ? Width : PAL_wcslen(Buffer)) + 1;
                        }
                        else if (Type == SCANF_TYPE_CHAR)
                        {
                            // Check whether the format string contains number of characters
                            // that should be read from the input string.
                            // Note: '\0' does not get appended in the "%c" case.
                            typeLen = (Width > 0) ? Width : 1;
                        }

                        if (typeLen > 0)
                        {
                            ret = sscanf_s(newBuff, TempBuff, voidPtr, typeLen, &n);
                        }
                        else
                            ret = sscanf_s(newBuff, TempBuff, voidPtr, &n);
                    }
                }
                else
                {
                    ret = sscanf_s(newBuff, TempBuff, &n);
                }

#if SSCANF_CANNOT_HANDLE_MISSING_EXPONENT
                if ((ret == 0) && (Type == SCANF_TYPE_FLOAT))
                {
                    ret = SscanfFloatCheckExponent(newBuff, TempBuff, voidPtr, &n);
                }
#endif // SSCANF_CANNOT_HANDLE_MISSING_EXPONENT

                PAL_free(newBuff);
                if (ret > 0)
                {
                    Length += ret;
                }
                else
                {
                    /* no match; break scan */
                    break;
                }
                Buff += n;
            }
       }
        else
        {
            /* grab, but not store */
            if (*Fmt == *Buff && Type != SCANF_TYPE_SPACE)
            {
                ++Fmt;
                ++Buff;
            }
            /* doesn't match, break scan */
            else
            {
                break;
            }
        }
    }

    return Length;
}